

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O0

void __thiscall CMud::LoadObjLimits(CMud *this)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  bool bVar1;
  char cVar2;
  ostream *this_00;
  reference pbVar3;
  char *pcVar4;
  FILE *__stream;
  int *piVar5;
  OBJ_INDEX_DATA *pOVar6;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  long in_RDI;
  OBJ_INDEX_DATA *pObjIndex;
  char *word;
  char letter;
  bool breakout;
  int plevel;
  int lastlogin;
  int vnum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ofstream player_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  CDirectory dir;
  float tempfloat;
  long min_bounty;
  long temp_bounty;
  int i;
  char pbuf [100];
  char temp_player_name [4608];
  char chkbuf [4608];
  char strPlr [4608];
  FILE *fpChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc4c8;
  FILE *in_stack_ffffffffffffc4d0;
  undefined4 in_stack_ffffffffffffc4d8;
  int in_stack_ffffffffffffc4dc;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffc4e0;
  string *in_stack_ffffffffffffc4e8;
  OBJ_INDEX_DATA *in_stack_ffffffffffffc4f0;
  int in_stack_ffffffffffffc4f8;
  undefined4 in_stack_ffffffffffffc4fc;
  allocator<char> *in_stack_ffffffffffffc500;
  undefined6 in_stack_ffffffffffffc508;
  undefined1 in_stack_ffffffffffffc50e;
  undefined1 in_stack_ffffffffffffc50f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc510;
  undefined4 in_stack_ffffffffffffc518;
  int in_stack_ffffffffffffc51c;
  char *local_3a08;
  int local_39fc;
  int local_39f8;
  string *in_stack_ffffffffffffc620;
  undefined4 in_stack_ffffffffffffc628;
  undefined4 in_stack_ffffffffffffc62c;
  int iVar7;
  string local_39c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_39a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3998;
  undefined1 *local_3990;
  string local_3988 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3968;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3960;
  undefined1 *local_3958;
  ostream local_3950 [519];
  allocator<char> local_3749;
  string local_3748 [32];
  undefined1 local_3728 [47];
  allocator<char> local_36f9;
  string local_36f8 [84];
  float local_36a4;
  undefined8 local_36a0;
  undefined8 local_3698;
  int local_368c;
  char local_3618 [4608];
  char local_2418 [3336];
  FILE *in_stack_ffffffffffffe8f0;
  char local_1218 [3335];
  undefined1 in_stack_fffffffffffffaef;
  char *in_stack_fffffffffffffaf0;
  
  local_36a0 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffc4e0,
             (char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
  fmt._M_len._4_4_ = in_stack_ffffffffffffc4fc;
  fmt._M_len._0_4_ = in_stack_ffffffffffffc4f8;
  fmt._M_str = (char *)in_stack_ffffffffffffc500;
  CLogger::Info<>((CLogger *)in_stack_ffffffffffffc4f0,fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc510,
             (char *)CONCAT17(in_stack_ffffffffffffc50f,
                              CONCAT16(in_stack_ffffffffffffc50e,in_stack_ffffffffffffc508)),
             in_stack_ffffffffffffc500);
  CDirectory::CDirectory((CDirectory *)in_stack_ffffffffffffc4f0,in_stack_ffffffffffffc4e8);
  std::__cxx11::string::~string(local_36f8);
  std::allocator<char>::~allocator(&local_36f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc510,
             (char *)CONCAT17(in_stack_ffffffffffffc50f,
                              CONCAT16(in_stack_ffffffffffffc50e,in_stack_ffffffffffffc508)),
             in_stack_ffffffffffffc500);
  CDirectory::GetFiles
            ((CDirectory *)CONCAT44(in_stack_ffffffffffffc62c,in_stack_ffffffffffffc628),
             in_stack_ffffffffffffc620);
  std::__cxx11::string::~string(local_3748);
  std::allocator<char>::~allocator(&local_3749);
  std::ofstream::ofstream(local_3950,"../player/Player.lst",_S_trunc);
  local_3958 = local_3728;
  local_3960._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffc4c8);
  local_3968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_ffffffffffffc4c8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffc4d0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffc4c8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_3960);
    std::__cxx11::string::string(local_3988,(string *)pbVar3);
    this_00 = std::operator<<(local_3950,local_3988);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3988);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3960);
  }
  std::ofstream::close();
  sprintf(local_2418,"%s/%s","../player","Zzz.plr");
  local_3990 = local_3728;
  local_3998._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffc4c8);
  local_39a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_ffffffffffffc4c8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffc4d0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffc4c8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_3998);
    std::__cxx11::string::string(local_39c0,(string *)pbVar3);
    pcVar4 = (char *)std::__cxx11::string::data();
    strcpy(local_1218,pcVar4);
    if ((bDebug & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffc4e0,
                 (char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
      fmt_00._M_len._4_4_ = in_stack_ffffffffffffc4fc;
      fmt_00._M_len._0_4_ = in_stack_ffffffffffffc4f8;
      fmt_00._M_str = (char *)in_stack_ffffffffffffc500;
      CLogger::Debug<>((CLogger *)in_stack_ffffffffffffc4f0,fmt_00);
    }
    bVar1 = str_cmp(local_1218,local_2418);
    if (bVar1) {
      __stream = fopen(local_1218,"r");
      if (__stream == (FILE *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffc4e0,
                   (char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
        piVar5 = __errno_location();
        strerror(*piVar5);
        fmt_03._M_str._0_4_ = in_stack_ffffffffffffc518;
        fmt_03._M_len = (size_t)in_stack_ffffffffffffc510;
        fmt_03._M_str._4_4_ = in_stack_ffffffffffffc51c;
        CLogger::Error<char(&)[4608],char*>
                  ((CLogger *)
                   CONCAT17(in_stack_ffffffffffffc50f,
                            CONCAT16(in_stack_ffffffffffffc50e,in_stack_ffffffffffffc508)),fmt_03,
                   (char (*) [4608])in_stack_ffffffffffffc500,
                   (char **)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8));
        ::exit(1);
      }
      num_pfiles = num_pfiles + 1;
      local_3698 = 0;
      while( true ) {
        do {
          local_39f8 = 0;
          local_39fc = 0;
          local_3618[0] = '\0';
          cVar2 = fread_letter(in_stack_ffffffffffffc4d0);
        } while (cVar2 != '#');
        local_3a08 = fread_word((FILE *)in_stack_ffffffffffffc4f0);
        bVar1 = str_cmp(local_3a08,"End");
        if (!bVar1) goto LAB_007a5fc3;
        bVar1 = str_cmp(local_3a08,"PLAYER");
        if (!bVar1) {
          do {
            local_3a08 = fread_word((FILE *)in_stack_ffffffffffffc4f0);
            bVar1 = str_cmp(local_3a08,"Name");
            if ((!bVar1) && (local_3618[0] == '\0')) {
              pcVar4 = fread_string((FILE *)pbuf._56_8_);
              sprintf(local_3618,"%s",pcVar4);
            }
            bVar1 = str_cmp(local_3a08,"Cabal");
            if (!bVar1) {
              fread_string((FILE *)pbuf._56_8_);
              iVar7 = cabal_lookup((char *)CONCAT44(in_stack_ffffffffffffc4dc,
                                                    in_stack_ffffffffffffc4d8));
              cabal_members[iVar7] = cabal_members[iVar7] + 1;
            }
            bVar1 = str_cmp(local_3a08,"LogO");
            if ((!bVar1) && (local_39f8 == 0)) {
              local_39f8 = fread_number(in_stack_ffffffffffffe8f0);
            }
            bVar1 = str_cmp(local_3a08,"Levl");
            if (!bVar1) {
              in_stack_ffffffffffffc51c = fread_number(in_stack_ffffffffffffe8f0);
              local_39fc = in_stack_ffffffffffffc51c;
            }
            bVar1 = str_cmp(local_3a08,"End");
            in_stack_ffffffffffffc518 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffc518);
          } while (bVar1);
        }
        if ((((local_39f8 != 0) && (local_39fc != 0)) && (local_39fc < 0x34)) &&
           (local_39f8 + 0x34bc00 < current_time)) break;
        in_stack_ffffffffffffc50f = str_cmp(local_3a08,"O");
        if ((!(bool)in_stack_ffffffffffffc50f) ||
           (in_stack_ffffffffffffc50e = str_cmp(local_3a08,"OBJECT"),
           !(bool)in_stack_ffffffffffffc50e)) {
          in_stack_ffffffffffffc500 =
               (allocator<char> *)fread_word((FILE *)in_stack_ffffffffffffc4f0);
          bVar1 = str_cmp((char *)in_stack_ffffffffffffc500,"Vnum");
          in_stack_ffffffffffffc4fc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffc4fc);
          if (!bVar1) {
            in_stack_ffffffffffffc4f8 = fread_number(in_stack_ffffffffffffe8f0);
            in_stack_ffffffffffffc4f0 = get_obj_index(in_stack_ffffffffffffc4dc);
            if (in_stack_ffffffffffffc4f0 != (OBJ_INDEX_DATA *)0x0) {
              pOVar6 = get_obj_index(in_stack_ffffffffffffc4dc);
              pOVar6->limcount = pOVar6->limcount + 1;
            }
          }
        }
      }
      in_stack_ffffffffffffc510 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x140);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffc4e0,
                 (char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
      fmt_04._M_str._0_4_ = in_stack_ffffffffffffc518;
      fmt_04._M_len = (size_t)in_stack_ffffffffffffc510;
      fmt_04._M_str._4_4_ = in_stack_ffffffffffffc51c;
      CLogger::Info<char(&)[4608]>
                ((CLogger *)
                 CONCAT17(in_stack_ffffffffffffc50f,
                          CONCAT16(in_stack_ffffffffffffc50e,in_stack_ffffffffffffc508)),fmt_04,
                 (char (*) [4608])in_stack_ffffffffffffc500);
      delete_char(in_stack_fffffffffffffaf0,(bool)in_stack_fffffffffffffaef);
LAB_007a5fc3:
      fclose(__stream);
      iVar7 = 0;
    }
    else {
      iVar7 = 4;
    }
    std::__cxx11::string::~string(local_39c0);
    if (iVar7 != 0) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3998);
  }
  this_01 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x140);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_01,(char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
  fmt_01._M_len._4_4_ = in_stack_ffffffffffffc4fc;
  fmt_01._M_len._0_4_ = in_stack_ffffffffffffc4f8;
  fmt_01._M_str = (char *)in_stack_ffffffffffffc500;
  CLogger::Info<>((CLogger *)in_stack_ffffffffffffc4f0,fmt_01);
  for (local_368c = 1; local_368c < 7; local_368c = local_368c + 1) {
    local_36a4 = (float)(num_pfiles / (int)cabal_table[local_368c].max_members);
    if ((short)(int)local_36a4 < 0x10) {
      in_stack_ffffffffffffc4dc = 0xf;
    }
    else {
      in_stack_ffffffffffffc4dc = (int)(short)(int)local_36a4;
    }
    cabal_max[local_368c] = (short)in_stack_ffffffffffffc4dc;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_01,(char *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
  fmt_02._M_len._4_4_ = in_stack_ffffffffffffc4fc;
  fmt_02._M_len._0_4_ = in_stack_ffffffffffffc4f8;
  fmt_02._M_str = (char *)in_stack_ffffffffffffc500;
  CLogger::Info<>((CLogger *)in_stack_ffffffffffffc4f0,fmt_02);
  std::ofstream::~ofstream(local_3950);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  CDirectory::~CDirectory((CDirectory *)0x7a6170);
  return;
}

Assistant:

void CMud::LoadObjLimits()
{
	FILE *fpChar;
	char strPlr[MAX_INPUT_LENGTH];
	char chkbuf[MAX_STRING_LENGTH];
	char temp_player_name[MSL];
	char pbuf[100];
	int i;
	long temp_bounty;
	long min_bounty = 0;
	float tempfloat;

	Logger.Info("Loading object counts off players now...");

	auto dir = CDirectory(RIFT_PLAYER_DIR);
	auto files = dir.GetFiles(".plr");

	std::ofstream player_list(PLAYER_LIST, std::ios::trunc);
	for(auto file : files) player_list << file << std::endl;
	player_list.close();

	//for(i=0;i<=MAX_TOP_BOUNTY;i++)
	//      top_bounty_value[i]=0;
	sprintf(chkbuf,"%s/%s", RIFT_PLAYER_DIR,"Zzz.plr");
	for (auto file : files)
	{
		strcpy(strPlr, file.data());
		if(bDebug)
			Logger.Debug(strPlr);

		if (!str_cmp(strPlr,chkbuf))
			break;

		fpChar = fopen(strPlr, "r");
		if (fpChar == nullptr)
		{
			RS.Logger.Error("LoadObjLimits: fopen {}: {}", strPlr, std::strerror(errno));
			exit(1);
		}

		num_pfiles++;
		temp_bounty=0;

		for (; ;)
		{
			int vnum, lastlogin = 0, plevel = 0;
			bool breakout;
			char letter;
			char *word;
			OBJ_INDEX_DATA *pObjIndex;

			temp_player_name[0] = '\0';
			letter = fread_letter(fpChar);

			if (letter != '#')
				continue;

			word = fread_word(fpChar);

			if (!str_cmp(word,"End"))
				break;

			if ( !str_cmp( word, "PLAYER"))
			{
				for ( ; ; )
				{
					word   = fread_word( fpChar );
					//NOTE: Be careful that occurrences of this word INSIDE role/desc don't fuck it up!
					//read before/after role/desc and test accordingly
					if(!str_cmp(word,"Name") && temp_player_name[0] == '\0')
						sprintf(temp_player_name,"%s",fread_string( fpChar ));
					if(!str_cmp(word,"Cabal"))
						cabal_members[cabal_lookup(fread_string(fpChar))]++;
					if(!str_cmp(word,"LogO") && lastlogin == 0)
						lastlogin = fread_number(fpChar);
					if(!str_cmp(word,"Levl"))
						plevel = fread_number(fpChar);
					if(!str_cmp(word,"End"))
						break;
				}
			}

			if(lastlogin && plevel && plevel < 52 && lastlogin + 3456000 < current_time)
			{
				Logger.Info("Autodeleting {}.", temp_player_name);
				breakout = true;
				delete_char(temp_player_name, true);
				break;
			}

			if ( !str_cmp( word, "O") || !str_cmp( word, "OBJECT"))
			{
				word = fread_word(fpChar);

				if (!str_cmp(word, "Vnum"))
				{
					vnum = fread_number(fpChar);
					if ( (get_obj_index(vnum)) != nullptr)
					{
						pObjIndex = get_obj_index(vnum);
						pObjIndex->limcount++;
					}
				}
			}
		}

		fclose(fpChar);
		fpChar = nullptr;
	}